

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadController(ColladaParser *this,Controller *pController)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_79;
  string local_78;
  long local_58;
  char *source;
  char *semantics;
  uint local_40;
  int sourceIndex_1;
  int semanticsIndex;
  uint a;
  char *content;
  char *pcStack_28;
  int sourceIndex;
  char *method;
  int methodIndex;
  int baseIndex;
  Controller *pController_local;
  ColladaParser *this_local;
  
  pController->mType = Skin;
  pController->mMethod = Normalized;
  _methodIndex = pController;
  pController_local = (Controller *)this;
LAB_006752b3:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
                    if ((uVar2 & 1) == 0) {
                      return;
                    }
                    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                    if (iVar3 == 1) break;
                    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                    if (iVar3 == 2) {
                      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                      iVar3 = strcmp((char *)CONCAT44(extraout_var_05,iVar3),"controller");
                      if (iVar3 == 0) {
                        return;
                      }
                      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                      iVar3 = strcmp((char *)CONCAT44(extraout_var_06,iVar3),"skin");
                      if (iVar3 != 0) {
                        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                        iVar3 = strcmp((char *)CONCAT44(extraout_var_07,iVar3),"morph");
                        if (iVar3 != 0) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_b0,"Expected end of <controller> element.",
                                     &local_b1);
                          ThrowException(this,&local_b0);
                        }
                      }
                    }
                  }
                  bVar1 = IsElement(this,"morph");
                  if (!bVar1) break;
                  _methodIndex->mType = Morph;
                  method._4_4_ = GetAttribute(this,"source");
                  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])
                                    (this->mReader,(ulong)method._4_4_);
                  std::__cxx11::string::operator=
                            ((string *)&_methodIndex->mMeshId,
                             (char *)(CONCAT44(extraout_var,iVar3) + 1));
                  method._0_4_ = GetAttribute(this,"method");
                  if (0 < (int)(uint)method) {
                    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])
                                      (this->mReader,(ulong)(uint)method);
                    pcStack_28 = (char *)CONCAT44(extraout_var_00,iVar3);
                    iVar3 = strcmp(pcStack_28,"RELATIVE");
                    if (iVar3 == 0) {
                      _methodIndex->mMethod = Relative;
                    }
                  }
                }
                bVar1 = IsElement(this,"skin");
                if (!bVar1) break;
                content._4_4_ = GetAttribute(this,"source");
                iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)content._4_4_)
                ;
                std::__cxx11::string::operator=
                          ((string *)&_methodIndex->mMeshId,
                           (char *)(CONCAT44(extraout_var_01,iVar3) + 1));
              }
              bVar1 = IsElement(this,"bind_shape_matrix");
              if (!bVar1) break;
              _semanticsIndex = GetTextContent(this);
              for (sourceIndex_1 = 0; (uint)sourceIndex_1 < 0x10; sourceIndex_1 = sourceIndex_1 + 1)
              {
                _semanticsIndex =
                     fast_atoreal_move<float>
                               (_semanticsIndex,_methodIndex->mBindShapeMatrix + (uint)sourceIndex_1
                                ,true);
                SkipSpacesAndLineEnd<char>((char **)&semanticsIndex);
              }
              TestClosing(this,"bind_shape_matrix");
            }
            bVar1 = IsElement(this,"source");
            if (!bVar1) break;
            ReadSource(this);
          }
          bVar1 = IsElement(this,"joints");
          if (!bVar1) break;
          ReadControllerJoints(this,_methodIndex);
        }
        bVar1 = IsElement(this,"vertex_weights");
        if (!bVar1) break;
        ReadControllerWeights(this,_methodIndex);
      }
      bVar1 = IsElement(this,"targets");
      if (bVar1) break;
      SkipElement(this);
    }
    do {
      while( true ) {
        uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((uVar2 & 1) == 0) goto LAB_006752b3;
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar3 != 1) break;
        bVar1 = IsElement(this,"input");
        if (bVar1) {
          local_40 = GetAttribute(this,"semantic");
          semantics._4_4_ = GetAttribute(this,"source");
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_40);
          source = (char *)CONCAT44(extraout_var_02,iVar3);
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)semantics._4_4_);
          local_58 = CONCAT44(extraout_var_03,iVar3);
          iVar3 = strcmp(source,"MORPH_TARGET");
          if (iVar3 == 0) {
            std::__cxx11::string::operator=
                      ((string *)&_methodIndex->mMorphTarget,(char *)(local_58 + 1));
          }
          else {
            iVar3 = strcmp(source,"MORPH_WEIGHT");
            if (iVar3 == 0) {
              std::__cxx11::string::operator=
                        ((string *)&_methodIndex->mMorphWeight,(char *)(local_58 + 1));
            }
          }
        }
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar3 != 2);
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar3 = strcmp((char *)CONCAT44(extraout_var_04,iVar3),"targets");
    if (iVar3 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Expected end of <targets> element.",&local_79);
      ThrowException(this,&local_78);
    }
  } while( true );
}

Assistant:

void ColladaParser::ReadController(Collada::Controller& pController)
{
    // initial values
    pController.mType = Skin;
    pController.mMethod = Normalized;
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            // two types of controllers: "skin" and "morph". Only the first one is relevant, we skip the other
            if (IsElement("morph"))
            {
                pController.mType = Morph;
                int baseIndex = GetAttribute("source");
                pController.mMeshId = mReader->getAttributeValue(baseIndex) + 1;
                int methodIndex = GetAttribute("method");
                if (methodIndex > 0) {
                    const char *method = mReader->getAttributeValue(methodIndex);
                    if (strcmp(method, "RELATIVE") == 0)
                        pController.mMethod = Relative;
                }
            }
            else if (IsElement("skin"))
            {
                // read the mesh it refers to. According to the spec this could also be another
                // controller, but I refuse to implement every single idea they've come up with
                int sourceIndex = GetAttribute("source");
                pController.mMeshId = mReader->getAttributeValue(sourceIndex) + 1;
            }
            else if (IsElement("bind_shape_matrix"))
            {
                // content is 16 floats to define a matrix... it seems to be important for some models
                const char* content = GetTextContent();

                // read the 16 floats
                for (unsigned int a = 0; a < 16; a++)
                {
                    // read a number
                    content = fast_atoreal_move<ai_real>(content, pController.mBindShapeMatrix[a]);
                    // skip whitespace after it
                    SkipSpacesAndLineEnd(&content);
                }

                TestClosing("bind_shape_matrix");
            }
            else if (IsElement("source"))
            {
                // data array - we have specialists to handle this
                ReadSource();
            }
            else if (IsElement("joints"))
            {
                ReadControllerJoints(pController);
            }
            else if (IsElement("vertex_weights"))
            {
                ReadControllerWeights(pController);
            }
            else if (IsElement("targets"))
            {
                while (mReader->read()) {
                    if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
                        if (IsElement("input")) {
                            int semanticsIndex = GetAttribute("semantic");
                            int sourceIndex = GetAttribute("source");

                            const char *semantics = mReader->getAttributeValue(semanticsIndex);
                            const char *source = mReader->getAttributeValue(sourceIndex);
                            if (strcmp(semantics, "MORPH_TARGET") == 0) {
                                pController.mMorphTarget = source + 1;
                            }
                            else if (strcmp(semantics, "MORPH_WEIGHT") == 0)
                            {
                                pController.mMorphWeight = source + 1;
                            }
                        }
                    }
                    else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
                        if (strcmp(mReader->getNodeName(), "targets") == 0)
                            break;
                        else
                            ThrowException("Expected end of <targets> element.");
                    }
                }
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "controller") == 0)
                break;
            else if (strcmp(mReader->getNodeName(), "skin") != 0 && strcmp(mReader->getNodeName(), "morph") != 0)
                ThrowException("Expected end of <controller> element.");
        }
    }
}